

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

PolicyStatus __thiscall cmState::Snapshot::GetPolicy(Snapshot *this,PolicyID id)

{
  iterator other;
  bool bVar1;
  PointerType pSVar2;
  PointerType pBVar3;
  PointerType pPVar4;
  int iVar5;
  iterator other_00;
  iterator dir;
  PositionType p;
  PositionType e;
  iterator leaf;
  PolicyStatus local_7c;
  iterator local_78;
  iterator local_68;
  iterator local_58;
  iterator local_48;
  
  local_7c = cmPolicies::GetPolicyStatus(id);
  if (1 < local_7c - REQUIRED_IF_USED) {
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
    local_78.Tree = (pSVar2->BuildSystemDirectory).Tree;
    local_78.Position = (pSVar2->BuildSystemDirectory).Position;
    do {
      if ((local_78.Tree == (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)0x0) ||
         ((ulong)(((long)((local_78.Tree)->Data).
                         super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)((local_78.Tree)->Data).
                         super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6fb586fb586fb587) <
          local_78.Position)) {
        __assert_fail("dir.IsValid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                      ,0x4f5,
                      "cmPolicies::PolicyStatus cmState::Snapshot::GetPolicy(cmPolicies::PolicyID) const"
                     );
      }
      pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->(&local_78)
      ;
      pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&pBVar3->DirectoryEnd);
      local_48.Tree = (pSVar2->Policies).Tree;
      local_48.Position = (pSVar2->Policies).Position;
      pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->(&local_78)
      ;
      pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&pBVar3->DirectoryEnd);
      other = pSVar2->PolicyRoot;
      while (bVar1 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator!=(&local_48,other),
            bVar1) {
        pPVar4 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator->(&local_48);
        bVar1 = cmPolicies::PolicyMap::IsDefined(&pPVar4->super_PolicyMap,id);
        if (bVar1) {
          pPVar4 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator->(&local_48);
          local_7c = cmPolicies::PolicyMap::Get(&pPVar4->super_PolicyMap,id);
          iVar5 = 1;
          goto LAB_002ff596;
        }
        cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator++(&local_48);
      }
      pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->(&local_78)
      ;
      local_58.Tree = (pBVar3->DirectoryEnd).Tree;
      local_58.Position = (pBVar3->DirectoryEnd).Position;
      pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_58);
      local_68.Tree = (pSVar2->DirectoryParent).Tree;
      local_68.Position = (pSVar2->DirectoryParent).Position;
      other_00.Tree = &this->State->SnapshotData;
      other_00.Position = 0;
      bVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator==(&local_68,other_00);
      iVar5 = 3;
      if (!bVar1) {
        pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_68);
        local_78.Tree = (pSVar2->BuildSystemDirectory).Tree;
        local_78.Position = (pSVar2->BuildSystemDirectory).Position;
        iVar5 = 0;
      }
LAB_002ff596:
    } while (iVar5 == 0);
  }
  return local_7c;
}

Assistant:

cmPolicies::PolicyStatus
cmState::Snapshot::GetPolicy(cmPolicies::PolicyID id) const
{
  cmPolicies::PolicyStatus status = cmPolicies::GetPolicyStatus(id);

  if(status == cmPolicies::REQUIRED_ALWAYS ||
     status == cmPolicies::REQUIRED_IF_USED)
    {
    return status;
    }

  cmLinkedTree<BuildsystemDirectoryStateType>::iterator dir =
      this->Position->BuildSystemDirectory;

  while (true)
    {
    assert(dir.IsValid());
    cmLinkedTree<PolicyStackEntry>::iterator leaf =
        dir->DirectoryEnd->Policies;
    cmLinkedTree<PolicyStackEntry>::iterator root =
        dir->DirectoryEnd->PolicyRoot;
    for( ; leaf != root; ++leaf)
      {
      if(leaf->IsDefined(id))
        {
        status = leaf->Get(id);
        return status;
        }
      }
    cmState::PositionType e = dir->DirectoryEnd;
    cmState::PositionType p = e->DirectoryParent;
    if (p == this->State->SnapshotData.Root())
      {
      break;
      }
    dir = p->BuildSystemDirectory;
    }
  return status;
}